

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexttable.cpp
# Opt level: O2

void __thiscall QTextTable::insertColumns(QTextTable *this,int pos,int num)

{
  uint *puVar1;
  QTextFormatCollection *this_00;
  QTextTablePrivate *this_01;
  QTextDocumentPrivate *this_02;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int charFormat;
  int blockFormat;
  uint *puVar7;
  reference pvVar8;
  long lVar9;
  int iVar10;
  size_type sVar11;
  uint uVar12;
  ulong uVar13;
  int i;
  ulong uVar14;
  vector<int,_std::allocator<int>_> *this_03;
  long in_FS_OFFSET;
  uint local_9c;
  QArrayDataPointer<int> local_98;
  QArrayDataPointer<QTextLength> local_78;
  QTextFormat local_58;
  QSharedDataPointer<QTextFormatPrivate> local_48;
  QTextFormat *pQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < num) {
    this_01 = *(QTextTablePrivate **)&(this->super_QTextFrame).super_QTextObject.field_0x8;
    if (this_01->dirty == true) {
      QTextTablePrivate::update(this_01);
    }
    uVar5 = this_01->nCols;
    uVar12 = pos;
    if ((int)uVar5 < pos) {
      uVar12 = uVar5;
    }
    if (pos < 0) {
      uVar12 = uVar5;
    }
    this_02 = (this_01->super_QTextFramePrivate).super_QTextObjectPrivate.pieceTable;
    this_00 = &this_02->formats;
    QTextDocumentPrivate::beginEditBlock(this_02);
    local_98.d = (Data *)0x0;
    local_98.ptr = (int *)0x0;
    local_98.size = 0;
    this_03 = &this_01->grid;
    puVar1 = &(this_01->super_QTextFramePrivate).fragment_end;
    for (iVar10 = 0; iVar10 < this_01->nRows; iVar10 = iVar10 + 1) {
      local_9c = 0xaaaaaaaa;
      uVar5 = this_01->nCols;
      if (uVar12 == uVar5 && this_01->nRows + -1 == iVar10) {
LAB_004ae722:
        local_9c = *puVar1;
      }
      else {
        if ((int)uVar12 < 1) {
          iVar4 = -1;
        }
        else {
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             (this_03,(long)(int)(uVar5 * iVar10 + (uVar12 - 1)));
          iVar4 = QTextTablePrivate::findCellIndex(this_01,*pvVar8);
          uVar5 = this_01->nCols;
        }
        sVar11 = (size_type)(int)(uVar5 * iVar10 + uVar12);
        do {
          puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](this_03,sVar11);
          local_9c = *puVar7;
          iVar6 = QTextTablePrivate::findCellIndex(this_01,local_9c);
          if (iVar4 <= iVar6) goto LAB_004ae72d;
          sVar11 = sVar11 + 1;
          lVar9 = (long)this_01->nCols * (long)this_01->nRows;
        } while ((long)sVar11 < lVar9);
        if ((int)sVar11 == (int)lVar9) goto LAB_004ae722;
      }
LAB_004ae72d:
      uVar2 = local_9c;
      if ((((int)uVar12 < 1) || (this_01->nCols <= (int)uVar12)) ||
         (puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                     (this_03,(long)(int)(this_01->nCols * iVar10 + (uVar12 - 1))),
         uVar2 != *puVar7)) {
        uVar2 = local_9c;
        if (((iVar10 != 0) && ((int)uVar12 < this_01->nCols)) &&
           (puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                       (this_03,(long)(int)(this_01->nCols * (iVar10 + -1) + uVar12)
                                       ), uVar2 == *puVar7)) {
          uVar14 = (long)this_01->nRows * (long)this_01->nCols - 1;
          uVar5 = this_01->nCols * iVar10 + uVar12;
          sVar11 = (size_type)(int)uVar5;
          uVar13 = uVar14 & 0xffffffff;
          if ((int)uVar14 < (int)uVar5) {
            uVar13 = (ulong)uVar5;
          }
          for (; uVar2 = local_9c, iVar4 = (int)uVar13, (long)sVar11 < (long)uVar14;
              sVar11 = sVar11 + 1) {
            puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](this_03,sVar11);
            if (uVar2 != *puVar7) {
              iVar4 = (int)sVar11;
              break;
            }
          }
          puVar7 = puVar1;
          if (iVar4 != (int)uVar14) {
            puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](this_03,(long)iVar4)
            ;
          }
          local_9c = *puVar7;
        }
        local_78.ptr = (QTextLength *)CONCAT44(0xaaaaaaaa,local_9c);
        local_48.d.ptr = (totally_ordered_wrapper<QTextFormatPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
        pQStack_40 = (QTextFormat *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d = (Data *)&this_02->fragments;
        QTextFormatCollection::charFormat
                  ((QTextFormatCollection *)&stack0xffffffffffffffb8,(int)this_00);
        QTextCharFormat::setTableCellRowSpan((QTextCharFormat *)&stack0xffffffffffffffb8,1);
        QTextCharFormat::setTableCellColumnSpan((QTextCharFormat *)&stack0xffffffffffffffb8,1);
        iVar6 = QFragmentMap<QTextFragmentData>::ConstIterator::position((ConstIterator *)&local_78)
        ;
        charFormat = QTextFormatCollection::indexForFormat
                               (this_00,(QTextFormat *)&stack0xffffffffffffffb8);
        QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)&local_58);
        blockFormat = QTextFormatCollection::indexForFormat(this_00,&local_58);
        QTextFormat::~QTextFormat(&local_58);
        iVar4 = num;
        while (bVar3 = iVar4 != 0, iVar4 = iVar4 + -1, bVar3) {
          QTextDocumentPrivate::insertBlock
                    (this_02,(QChar)0xfdd0,iVar6,blockFormat,charFormat,MoveCursor);
        }
        QTextFormat::~QTextFormat((QTextFormat *)&stack0xffffffffffffffb8);
      }
      else {
        bVar3 = QListSpecialMethodsBase<int>::contains<int>
                          ((QListSpecialMethodsBase<int> *)&local_98,(int *)&local_9c);
        if (!bVar3) {
          local_78.ptr = (QTextLength *)CONCAT44(0xaaaaaaaa,local_9c);
          local_48.d.ptr = (totally_ordered_wrapper<QTextFormatPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
          pQStack_40 = (QTextFormat *)&DAT_aaaaaaaaaaaaaaaa;
          local_78.d = (Data *)&this_02->fragments;
          QTextFormatCollection::charFormat
                    ((QTextFormatCollection *)&stack0xffffffffffffffb8,(int)this_00);
          iVar4 = QTextCharFormat::tableCellColumnSpan((QTextCharFormat *)&stack0xffffffffffffffb8);
          QTextCharFormat::setTableCellColumnSpan
                    ((QTextCharFormat *)&stack0xffffffffffffffb8,iVar4 + num);
          iVar4 = QFragmentMap<QTextFragmentData>::ConstIterator::position
                            ((ConstIterator *)&local_78);
          QTextDocumentPrivate::setCharFormat
                    (this_02,iVar4,1,(QTextCharFormat *)&stack0xffffffffffffffb8,SetFormat);
          this_01->dirty = true;
          QList<int>::append((QList<int> *)&local_98,local_9c);
          QTextFormat::~QTextFormat((QTextFormat *)&stack0xffffffffffffffb8);
        }
      }
    }
    local_48.d.ptr = (totally_ordered_wrapper<QTextFormatPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
    pQStack_40 = (QTextFormat *)&DAT_aaaaaaaaaaaaaaaa;
    format((QTextTable *)&stack0xffffffffffffffb8);
    iVar10 = QTextTableFormat::columns((QTextTableFormat *)&stack0xffffffffffffffb8);
    QTextTableFormat::setColumns((QTextTableFormat *)&stack0xffffffffffffffb8,iVar10 + num);
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (QTextLength *)&DAT_aaaaaaaaaaaaaaaa;
    QTextTableFormat::columnWidthConstraints
              ((QList<QTextLength> *)&local_78,(QTextTableFormat *)&stack0xffffffffffffffb8);
    if ((undefined1 *)local_78.size != (undefined1 *)0x0) {
      uVar5 = 1;
      if (1 < (int)uVar12) {
        uVar5 = uVar12;
      }
      for (; 0 < num; num = num + -1) {
        QList<QTextLength>::emplace<QTextLength_const&>
                  ((QList<QTextLength> *)&local_78,(long)(int)uVar12,
                   local_78.ptr + ((ulong)uVar5 - 1));
      }
    }
    QTextTableFormat::setColumnWidthConstraints
              ((QTextTableFormat *)&stack0xffffffffffffffb8,(QList<QTextLength> *)&local_78);
    QTextObject::setFormat((QTextObject *)this,(QTextFormat *)&stack0xffffffffffffffb8);
    QTextDocumentPrivate::endEditBlock(this_02);
    QArrayDataPointer<QTextLength>::~QArrayDataPointer(&local_78);
    QTextFormat::~QTextFormat((QTextFormat *)&stack0xffffffffffffffb8);
    QArrayDataPointer<int>::~QArrayDataPointer(&local_98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextTable::insertColumns(int pos, int num)
{
    Q_D(QTextTable);
    if (num <= 0)
        return;

    if (d->dirty)
        d->update();

    if (pos > d->nCols || pos < 0)
        pos = d->nCols;

//     qDebug() << "-------- insertCols" << pos << num;
    QTextDocumentPrivate *p = d->pieceTable;
    QTextFormatCollection *c = p->formatCollection();
    p->beginEditBlock();

    QList<int> extendedSpans;
    for (int i = 0; i < d->nRows; ++i) {
        int cell;
        if (i == d->nRows - 1 && pos == d->nCols) {
            cell = d->fragment_end;
        } else {
            int logicalGridIndexBeforePosition = pos > 0
                                                 ? d->findCellIndex(d->grid[i*d->nCols + pos - 1])
                                                 : -1;

            // Search for the logical insertion point by skipping past cells which are not the first
            // cell in a rowspan. This means any cell for which the logical grid index is
            // less than the logical cell index of the cell before the insertion.
            int logicalGridIndex;
            int gridArrayOffset = i*d->nCols + pos;
            do {
                cell = d->grid[gridArrayOffset];
                logicalGridIndex = d->findCellIndex(cell);
                gridArrayOffset++;
            } while (logicalGridIndex < logicalGridIndexBeforePosition
                     && gridArrayOffset < d->nRows*d->nCols);

            if (logicalGridIndex < logicalGridIndexBeforePosition
                && gridArrayOffset == d->nRows*d->nCols)
                cell = d->fragment_end;
        }

        if (pos > 0 && pos < d->nCols && cell == d->grid[i*d->nCols + pos - 1]) {
            // cell spans the insertion place, extend it
            if (!extendedSpans.contains(cell)) {
                QTextDocumentPrivate::FragmentIterator it(&p->fragmentMap(), cell);
                QTextCharFormat fmt = c->charFormat(it->format);
                fmt.setTableCellColumnSpan(fmt.tableCellColumnSpan() + num);
                p->setCharFormat(it.position(), 1, fmt);
                d->dirty = true;
                extendedSpans << cell;
            }
        } else {
            /* If the next cell is spanned from the row above, we need to find the right position
            to insert to */
            if (i > 0 && pos < d->nCols && cell == d->grid[(i-1) * d->nCols + pos]) {
                int gridIndex = i*d->nCols + pos;
                const int gridEnd = d->nRows * d->nCols - 1;
                while (gridIndex < gridEnd && cell == d->grid[gridIndex]) {
                    ++gridIndex;
                }
                if (gridIndex == gridEnd)
                    cell = d->fragment_end;
                else
                    cell = d->grid[gridIndex];
            }
            QTextDocumentPrivate::FragmentIterator it(&p->fragmentMap(), cell);
            QTextCharFormat fmt = c->charFormat(it->format);
            fmt.setTableCellRowSpan(1);
            fmt.setTableCellColumnSpan(1);
            Q_ASSERT(fmt.objectIndex() == objectIndex());
            int position = it.position();
            int cfmt = p->formatCollection()->indexForFormat(fmt);
            int bfmt = p->formatCollection()->indexForFormat(QTextBlockFormat());
            for (int i = 0; i < num; ++i)
                p->insertBlock(QTextBeginningOfFrame, position, bfmt, cfmt, QTextUndoCommand::MoveCursor);
        }
    }

    QTextTableFormat tfmt = format();
    tfmt.setColumns(tfmt.columns()+num);
    QList<QTextLength> columnWidths = tfmt.columnWidthConstraints();
    if (! columnWidths.isEmpty()) {
        for (int i = num; i > 0; --i)
            columnWidths.insert(pos, columnWidths.at(qMax(0, pos - 1)));
    }
    tfmt.setColumnWidthConstraints (columnWidths);
    QTextObject::setFormat(tfmt);

//     qDebug() << "-------- end insertCols" << pos << num;
    p->endEditBlock();
}